

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString __thiscall SimpleString::lowerCase(SimpleString *this)

{
  char cVar1;
  char *pcVar2;
  size_t n;
  long lVar3;
  long lVar4;
  undefined8 *in_RSI;
  char cVar5;
  
  pcVar2 = copyToNewBuffer((char *)*in_RSI,0);
  this->buffer_ = pcVar2;
  lVar3 = -1;
  do {
    lVar4 = lVar3 + 1;
    lVar3 = lVar3 + 1;
  } while (pcVar2[lVar4] != '\0');
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      cVar1 = pcVar2[lVar4];
      cVar5 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar5 = cVar1;
      }
      pcVar2[lVar4] = cVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString SimpleString::lowerCase() const
{
    SimpleString str(*this);

    size_t str_size = str.size();
    for (size_t i = 0; i < str_size; i++)
        str.buffer_[i] = ToLower(str.buffer_[i]);

    return str;
}